

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avxvnniint8.cpp
# Opt level: O0

void ncnn::transpose_pack_B_tile_int8_avxvnniint8(Mat *B,Mat *BT,int j,int max_jj,int k,int max_kk)

{
  int in_stack_00000128;
  int in_stack_0000012c;
  int in_stack_00000130;
  int in_stack_00000134;
  Mat *in_stack_00000138;
  Mat *in_stack_00000140;
  
  transpose_pack_B_tile_int8
            (in_stack_00000140,in_stack_00000138,in_stack_00000134,in_stack_00000130,
             in_stack_0000012c,in_stack_00000128);
  return;
}

Assistant:

void transpose_pack_B_tile_int8_avxvnniint8(const Mat& B, Mat& BT, int j, int max_jj, int k, int max_kk)
{
    transpose_pack_B_tile_int8(B, BT, j, max_jj, k, max_kk);
}